

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O3

void __thiscall IPAsKey::IPAsKey(IPAsKey *this,uint8_t *addr,size_t addr_len)

{
  size_t __n;
  
  this->_vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001e0560;
  this->HashNext = (IPAsKey *)0x0;
  this->count = 1;
  this->hash = 0;
  __n = 0x10;
  if (addr_len < 0x10) {
    __n = addr_len;
  }
  memcpy(this->addr,addr,__n);
  this->addr_len = __n;
  return;
}

Assistant:

IPAsKey::IPAsKey(uint8_t * addr, size_t addr_len)
    :
    HashNext(NULL),
    count(1),
    hash(0)
{
    if (addr_len > 16)
    {
        addr_len = 16;
    }

    memcpy(this->addr, addr, addr_len);
    this->addr_len = addr_len;
}